

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_test.c
# Opt level: O1

void debug_thread_reader_cv(debug_state *s,char *name)

{
  char *pcVar1;
  char **ppcVar2;
  
  nsync::nsync_mu_rlock(&s->mu);
  if (s->flag != 0) {
    do {
      nsync::nsync_cv_wait(&s->cv,&s->mu);
    } while (s->flag != 0);
  }
  if (name != (char *)0x0) {
    nsync::nsync_mu_lock(&s->result_mu);
    pcVar1 = (char *)malloc(0x400);
    pcVar1 = nsync::nsync_mu_debug_state_and_waiters(&s->mu,pcVar1,0x400);
    ppcVar2 = slot(s,name);
    *ppcVar2 = pcVar1;
    nsync::nsync_mu_unlock(&s->result_mu);
  }
  nsync::nsync_mu_runlock(&s->mu);
  return;
}

Assistant:

static void debug_thread_reader_cv (struct debug_state *s,
				    const char *name) {
	nsync_mu_rlock (&s->mu);
	while (s->flag != 0) {
		nsync_cv_wait (&s->cv, &s->mu);
	}
	if (name != NULL) {
		int len = 1024;
		nsync_mu_lock (&s->result_mu);
		*slot (s, name) = nsync_mu_debug_state_and_waiters (
			&s->mu, (char *) malloc (len), len);
		nsync_mu_unlock (&s->result_mu);
	}
	nsync_mu_runlock (&s->mu);
}